

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O3

void __thiscall DepfileParserTestBackSlashes::Run(DepfileParserTestBackSlashes *this)

{
  size_t sVar1;
  char *pcVar2;
  Test *pTVar3;
  bool bVar4;
  int iVar5;
  string err;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  string local_40;
  
  pTVar3 = g_current_test;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  bVar4 = DepfileParserTest::Parse
                    (&this->super_DepfileParserTest,
                     "Project\\Dir\\Build\\Release8\\Foo\\Foo.res : \\\n  Dir\\Library\\Foo.rc \\\n  Dir\\Library\\Version\\Bar.h \\\n  Dir\\Library\\Foo.ico \\\n  Project\\Thing\\Bar.tlb \\\n"
                     ,&local_40);
  testing::Test::Check
            (pTVar3,bVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/depfile_parser_test.cc"
             ,0x50,
             "Parse( \"Project\\\\Dir\\\\Build\\\\Release8\\\\Foo\\\\Foo.res : \\\\\\n\" \"  Dir\\\\Library\\\\Foo.rc \\\\\\n\" \"  Dir\\\\Library\\\\Version\\\\Bar.h \\\\\\n\" \"  Dir\\\\Library\\\\Foo.ico \\\\\\n\" \"  Project\\\\Thing\\\\Bar.tlb \\\\\\n\", &err)"
            );
  pTVar3 = g_current_test;
  iVar5 = std::__cxx11::string::compare((char *)&local_40);
  bVar4 = testing::Test::Check
                    (pTVar3,iVar5 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/depfile_parser_test.cc"
                     ,0x51,"\"\" == err");
  pTVar3 = g_current_test;
  if (bVar4) {
    sVar1 = (this->super_DepfileParserTest).parser_.out_.len_;
    if (sVar1 == 0) {
      local_60 = &local_50;
      local_58 = 0;
      local_50 = 0;
    }
    else {
      pcVar2 = (this->super_DepfileParserTest).parser_.out_.str_;
      local_60 = &local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,pcVar2,pcVar2 + sVar1);
    }
    iVar5 = std::__cxx11::string::compare((char *)&local_60);
    testing::Test::Check
              (pTVar3,iVar5 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/depfile_parser_test.cc"
               ,0x53,
               "\"Project\\\\Dir\\\\Build\\\\Release8\\\\Foo\\\\Foo.res\" == parser_.out_.AsString()"
              );
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
    }
    testing::Test::Check
              (g_current_test,
               (long)(this->super_DepfileParserTest).parser_.ins_.
                     super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->super_DepfileParserTest).parser_.ins_.
                     super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start == 0x40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/depfile_parser_test.cc"
               ,0x54,"4u == parser_.ins_.size()");
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(DepfileParserTest, BackSlashes) {
  string err;
  EXPECT_TRUE(Parse(
"Project\\Dir\\Build\\Release8\\Foo\\Foo.res : \\\n"
"  Dir\\Library\\Foo.rc \\\n"
"  Dir\\Library\\Version\\Bar.h \\\n"
"  Dir\\Library\\Foo.ico \\\n"
"  Project\\Thing\\Bar.tlb \\\n",
      &err));
  ASSERT_EQ("", err);
  EXPECT_EQ("Project\\Dir\\Build\\Release8\\Foo\\Foo.res",
            parser_.out_.AsString());
  EXPECT_EQ(4u, parser_.ins_.size());
}